

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void check_files(ifstream *in_file,string *in_name,ofstream *out_file,string *out_name)

{
  ulong uVar1;
  ostream *poVar2;
  string *out_name_local;
  ofstream *out_file_local;
  string *in_name_local;
  ifstream *in_file_local;
  
  uVar1 = std::ifstream::is_open();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Cannot open input file: ");
    poVar2 = std::operator<<(poVar2,(string *)in_name);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  uVar1 = std::ofstream::is_open();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Cannot open output file: ");
    poVar2 = std::operator<<(poVar2,(string *)out_name);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  return;
}

Assistant:

void check_files(ifstream& in_file, string& in_name,
                 ofstream& out_file, string& out_name) {
  if (!in_file.is_open()) {
    cerr << "Cannot open input file: " << in_name << endl;
    exit(EXIT_FAILURE);
  }

  if (!out_file.is_open()) {
    cerr << "Cannot open output file: " << out_name << endl;
    exit(EXIT_FAILURE);
  }
}